

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ndicapi.cxx
# Opt level: O3

int ndiGetGXNumberOfPassiveStrays(ndicapi *pol)

{
  uint uVar1;
  long lVar2;
  uint uVar3;
  
  if (pol->GxPassiveStray[0] != '\0') {
    lVar2 = ndiSignedToLong(pol->GxPassiveStray,3);
    uVar1 = (uint)lVar2;
    if (-1 < (int)uVar1) {
      uVar3 = 0x14;
      if (uVar1 < 0x14) {
        uVar3 = uVar1;
      }
      return uVar3;
    }
  }
  return 0;
}

Assistant:

ndicapiExport int ndiGetGXNumberOfPassiveStrays(ndicapi* pol)
{
  const char* dp;
  int n;

  dp = pol->GxPassiveStray;

  if (*dp == '\0')
  {
    return 0;
  }

  n = (int)ndiSignedToLong(dp, 3);
  if (n < 0)
  {
    return 0;
  }
  if (n > 20)
  {
    return 20;
  }

  return n;
}